

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

int __thiscall
glslang::TIntermediate::checkLocationRange
          (TIntermediate *this,int set,TIoRange *range,TType *type,bool *typeCollision)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pTVar6;
  TIoRange *pTVar7;
  TIoRange *extraout_RDX;
  vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *pvVar8;
  ulong uVar9;
  long lVar10;
  _Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *p_Var11;
  bool bVar12;
  
  pTVar6 = this->usedIo[set].
           super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar12 = this->usedIo[set].
           super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>._M_impl.
           super__Vector_impl_data._M_finish != pTVar6;
  pTVar7 = range;
  if (bVar12) {
    p_Var11 = &this->usedIo[set].
               super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>;
    lVar10 = 0;
    uVar9 = 0;
    do {
      bVar3 = TIoRange::overlap(range,(TIoRange *)((long)&(pTVar6->location).start + lVar10));
      pTVar6 = (p_Var11->_M_impl).super__Vector_impl_data._M_start;
      uVar1 = *(uint *)((long)&(pTVar6->location).start + lVar10);
      pTVar7 = (TIoRange *)(ulong)uVar1;
      if (bVar3) {
        uVar2 = (range->location).start;
        if ((int)uVar1 < (int)uVar2) {
          pTVar7 = (TIoRange *)(ulong)uVar2;
        }
        break;
      }
      if (((int)uVar1 <= (range->location).last) &&
         ((range->location).start <= *(int *)((long)&(pTVar6->location).last + lVar10))) {
        iVar4 = (*type->_vptr_TType[7])(type);
        iVar5 = *(int *)((long)&((p_Var11->_M_impl).super__Vector_impl_data._M_start)->basicType +
                        lVar10);
        if ((((((iVar4 == iVar5) || ((iVar4 == 4 && (iVar5 == 5)))) ||
              ((iVar4 == 5 && (iVar5 == 4)))) ||
             ((((iVar4 == 6 && (iVar5 == 7)) || ((iVar4 == 7 && (iVar5 == 6)))) ||
              ((iVar4 == 8 && (iVar5 == 9)))))) || ((iVar4 == 9 && (iVar5 == 8)))) ||
           ((iVar4 == 10 && (iVar5 == 0xb)))) {
LAB_00370167:
          iVar5 = (*type->_vptr_TType[0xb])(type);
          if (((((*(uint *)(CONCAT44(extraout_var,iVar5) + 8) >> 0x1d & 1) ==
                 (uint)(&((p_Var11->_M_impl).super__Vector_impl_data._M_start)->centroid)[lVar10])
               && (iVar5 = (*type->_vptr_TType[0xb])(type),
                  (*(uint *)(CONCAT44(extraout_var_00,iVar5) + 8) >> 0x1e & 1) ==
                  (uint)(&((p_Var11->_M_impl).super__Vector_impl_data._M_start)->smooth)[lVar10]))
              && (iVar5 = (*type->_vptr_TType[0xb])(type),
                 SUB41((uint)*(undefined4 *)(CONCAT44(extraout_var_01,iVar5) + 8) >> 0x1f,0) ==
                 (&((p_Var11->_M_impl).super__Vector_impl_data._M_start)->flat)[lVar10])) &&
             ((iVar5 = (*type->_vptr_TType[0xb])(type),
              ((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_02,iVar5) + 8) >> 0x2d) & 1) ==
              (uint)(&((p_Var11->_M_impl).super__Vector_impl_data._M_start)->sample)[lVar10] &&
              (iVar5 = (*type->_vptr_TType[0xb])(type), pTVar7 = extraout_RDX,
              ((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_03,iVar5) + 8) >> 0x2c) & 1) ==
              (uint)(&((p_Var11->_M_impl).super__Vector_impl_data._M_start)->patch)[lVar10]))))
          goto LAB_00370208;
        }
        else if ((iVar4 == iVar5) || (iVar4 == 0xb && iVar5 == 10)) goto LAB_00370167;
        *typeCollision = true;
        uVar1 = (range->location).start;
        uVar2 = *(uint *)((long)&(((p_Var11->_M_impl).super__Vector_impl_data._M_start)->location).
                                 start + lVar10);
        if ((int)uVar2 < (int)uVar1) {
          uVar2 = uVar1;
        }
        pTVar7 = (TIoRange *)(ulong)uVar2;
        break;
      }
LAB_00370208:
      uVar9 = uVar9 + 1;
      pTVar6 = (p_Var11->_M_impl).super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x20;
      bVar12 = uVar9 < (ulong)((long)this->usedIo[set].
                                     super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 5)
      ;
    } while (bVar12);
  }
  iVar5 = (int)pTVar7;
  if (!bVar12) {
    if ((set == 4) || (set == 1)) {
      pvVar8 = this->usedIo + 1;
      if (set != 4) {
        pvVar8 = this->usedIo + 4;
      }
      pTVar6 = (pvVar8->super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar12 = (pvVar8->super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
               _M_impl.super__Vector_impl_data._M_finish != pTVar6;
      if (bVar12) {
        lVar10 = 0;
        uVar9 = 0;
        do {
          if ((*(int *)((long)&(pTVar6->location).start + lVar10) <= (range->location).last) &&
             ((range->location).start <= *(int *)((long)&(pTVar6->location).last + lVar10))) {
            iVar4 = (*type->_vptr_TType[7])(type);
            pTVar6 = (pvVar8->
                     super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if (iVar4 != *(int *)((long)&pTVar6->basicType + lVar10)) {
              *typeCollision = true;
              iVar4 = (range->location).start;
              iVar5 = *(int *)((long)&(pTVar6->location).start + lVar10);
              if (iVar5 < iVar4) {
                iVar5 = iVar4;
              }
              break;
            }
          }
          uVar9 = uVar9 + 1;
          pTVar6 = (pvVar8->
                   super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x20;
          bVar12 = uVar9 < (ulong)((long)(pvVar8->
                                         super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6
                                  >> 5);
        } while (bVar12);
      }
      if (bVar12) {
        return iVar5;
      }
    }
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int TIntermediate::checkLocationRange(int set, const TIoRange& range, const TType& type, bool& typeCollision)
{
    for (size_t r = 0; r < usedIo[set].size(); ++r) {
        if (range.overlap(usedIo[set][r])) {
            // there is a collision; pick one
            return std::max(range.location.start, usedIo[set][r].location.start);
        } else if (range.location.overlap(usedIo[set][r].location) &&
                   (!checkCompatibleTypes(type.getBasicType(), usedIo[set][r].basicType) ||
                    type.getQualifier().centroid != usedIo[set][r].centroid ||
                    type.getQualifier().smooth != usedIo[set][r].smooth ||
                    type.getQualifier().flat != usedIo[set][r].flat ||
                    type.getQualifier().sample != usedIo[set][r].sample ||
                    type.getQualifier().patch != usedIo[set][r].patch)) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[set][r].location.start);
        }
    }

    // check typeCollision between tileImageEXT and out
    if (set == 4 || set == 1) {
      // if the set is "tileImageEXT", check against "out" and vice versa
      int againstSet = (set == 4) ? 1 : 4;
      for (size_t r = 0; r < usedIo[againstSet].size(); ++r) {
        if (range.location.overlap(usedIo[againstSet][r].location) && type.getBasicType() != usedIo[againstSet][r].basicType) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[againstSet][r].location.start);
        }
      }
    }

    return -1; // no collision
}